

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O3

ON_RTreeListNode * __thiscall ON_RTreeMemPool::AllocListNode(ON_RTreeMemPool *this)

{
  ON_RTreeListNode *pOVar1;
  
  pOVar1 = (ON_RTreeListNode *)this->m_list_nodes;
  if (pOVar1 == (ON_RTreeListNode *)0x0) {
    if (this->m_buffer_capacity < 0x10) {
      GrowBuffer(this);
    }
    pOVar1 = (ON_RTreeListNode *)this->m_buffer;
    if (pOVar1 == (ON_RTreeListNode *)0x0) {
      pOVar1 = (ON_RTreeListNode *)0x0;
    }
    else {
      this->m_buffer = (uchar *)(pOVar1 + 1);
      this->m_buffer_capacity = this->m_buffer_capacity - 0x10;
    }
  }
  else {
    this->m_list_nodes = (Blk *)pOVar1->m_next;
  }
  return pOVar1;
}

Assistant:

struct ON_RTreeListNode* ON_RTreeMemPool::AllocListNode()
{
  struct ON_RTreeListNode* list_node = (struct ON_RTreeListNode*)m_list_nodes;
  if ( list_node )
  {
    m_list_nodes = m_list_nodes->m_next;
  }
  else
  {
    size_t list_node_sz = sizeof(*list_node);
    if ( m_buffer_capacity < list_node_sz )
    {
      GrowBuffer();
    }
    list_node = (struct ON_RTreeListNode*)m_buffer;
    if ( list_node )
    {
      m_buffer += list_node_sz;
      m_buffer_capacity -= list_node_sz;
    }
  }
  return list_node;
}